

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::GetProperty
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance,Var originalInstance,
          PropertyId propertyId,Var *value,PropertyValueInfo *info,ScriptContext *requestContext)

{
  BOOL BVar1;
  DynamicObject *instance_00;
  uint32 local_34 [2];
  uint32 index;
  
  BVar1 = ScriptContext::IsNumericPropertyId
                    ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr,propertyId,local_34);
  if (BVar1 == 0) {
    BVar1 = DictionaryTypeHandlerBase<int>::GetProperty
                      (&this->super_DictionaryTypeHandlerBase<int>,instance,originalInstance,
                       propertyId,value,info,(ScriptContext *)info);
  }
  else {
    instance_00 = (DynamicObject *)VarTo<Js::ES5Array,Js::DynamicObject>(instance);
    BVar1 = GetItem(this,instance_00,instance,local_34[0],value,requestContext);
  }
  return BVar1;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::GetProperty(DynamicObject* instance, Var originalInstance, PropertyId propertyId, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            return GetItem(VarTo<ES5Array>(instance), instance, index, value, requestContext);
        }

        return __super::GetProperty(instance, originalInstance, propertyId, value, info, requestContext);
    }